

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Serializer::OnetimeMarshalAttribute(BP5Serializer *this,AttributeBase *baseAttr)

{
  DataType DVar1;
  DataType DVar2;
  BP5Serializer *in_RSI;
  Attribute<std::complex<double>_> *attribute_14;
  Attribute<std::complex<float>_> *attribute_13;
  Attribute<long_double> *attribute_12;
  Attribute<double> *attribute_11;
  Attribute<float> *attribute_10;
  Attribute<unsigned_long> *attribute_9;
  Attribute<unsigned_int> *attribute_8;
  Attribute<unsigned_short> *attribute_7;
  Attribute<unsigned_char> *attribute_6;
  Attribute<long> *attribute_5;
  Attribute<int> *attribute_4;
  Attribute<short> *attribute_3;
  Attribute<signed_char> *attribute_2;
  Attribute<char> *attribute_1;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *attribute;
  void *Data;
  size_t ElemCount;
  DataType Type;
  char *Name;
  long local_218;
  long local_200;
  long local_1e8;
  long local_1d0;
  long local_1b8;
  long local_1a0;
  long local_188;
  long local_170;
  long local_158;
  long local_140;
  long local_128;
  void *in_stack_fffffffffffffef0;
  BP5Serializer *in_stack_fffffffffffffef8;
  DataType in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  BP5Serializer *in_stack_ffffffffffffff10;
  long local_e0;
  long local_c8;
  
  std::__cxx11::string::c_str();
  DVar1 = (DataType)in_RSI->m_BufferBlockSize;
  if (DVar1 != None) {
    DVar2 = helper::GetDataType<std::__cxx11::string>();
    if (DVar1 == DVar2) {
      if (in_RSI == (BP5Serializer *)0x0) {
        local_c8 = 0;
      }
      else {
        local_c8 = __dynamic_cast(in_RSI,&core::AttributeBase::typeinfo,
                                  &core::Attribute<std::__cxx11::string>::typeinfo,0);
      }
      if ((*(byte *)(local_c8 + 0x38) & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_c8 + 0x40),0);
      }
    }
    else {
      DVar2 = helper::GetDataType<char>();
      if (DVar1 == DVar2) {
        if (in_RSI == (BP5Serializer *)0x0) {
          local_e0 = 0;
        }
        else {
          local_e0 = __dynamic_cast(in_RSI,&core::AttributeBase::typeinfo,
                                    &core::Attribute<char>::typeinfo,0);
        }
        if ((*(byte *)(local_e0 + 0x38) & 1) == 0) {
          std::vector<char,_std::allocator<char>_>::data
                    ((vector<char,_std::allocator<char>_> *)0xd132e2);
        }
      }
      else {
        DVar2 = helper::GetDataType<signed_char>();
        if (DVar1 == DVar2) {
          if (in_RSI == (BP5Serializer *)0x0) {
            in_stack_ffffffffffffff08 = (char *)0x0;
          }
          else {
            in_stack_ffffffffffffff08 =
                 (char *)__dynamic_cast(in_RSI,&core::AttributeBase::typeinfo,
                                        &core::Attribute<signed_char>::typeinfo,0);
          }
          in_stack_ffffffffffffff10 = in_RSI;
          if ((in_stack_ffffffffffffff08[0x38] & 1U) == 0) {
            std::vector<signed_char,_std::allocator<signed_char>_>::data
                      ((vector<signed_char,_std::allocator<signed_char>_> *)0xd133a1);
            in_stack_ffffffffffffff10 = in_RSI;
          }
        }
        else {
          in_stack_ffffffffffffff04 = DVar1;
          DVar2 = helper::GetDataType<short>();
          if (in_stack_ffffffffffffff04 == DVar2) {
            if (in_RSI == (BP5Serializer *)0x0) {
              in_stack_fffffffffffffef0 = (void *)0x0;
            }
            else {
              in_stack_fffffffffffffef0 =
                   (void *)__dynamic_cast(in_RSI,&core::AttributeBase::typeinfo,
                                          &core::Attribute<short>::typeinfo,0);
            }
            in_stack_fffffffffffffef8 = in_RSI;
            if ((*(byte *)((long)in_stack_fffffffffffffef0 + 0x38) & 1) == 0) {
              std::vector<short,_std::allocator<short>_>::data
                        ((vector<short,_std::allocator<short>_> *)0xd13460);
              in_stack_fffffffffffffef8 = in_RSI;
            }
          }
          else {
            DVar2 = helper::GetDataType<int>();
            if (DVar1 == DVar2) {
              if (in_RSI == (BP5Serializer *)0x0) {
                local_128 = 0;
              }
              else {
                local_128 = __dynamic_cast(in_RSI,&core::AttributeBase::typeinfo,
                                           &core::Attribute<int>::typeinfo,0);
              }
              if ((*(byte *)(local_128 + 0x38) & 1) == 0) {
                std::vector<int,_std::allocator<int>_>::data
                          ((vector<int,_std::allocator<int>_> *)0xd1351f);
              }
            }
            else {
              DVar2 = helper::GetDataType<long>();
              if (DVar1 == DVar2) {
                if (in_RSI == (BP5Serializer *)0x0) {
                  local_140 = 0;
                }
                else {
                  local_140 = __dynamic_cast(in_RSI,&core::AttributeBase::typeinfo,
                                             &core::Attribute<long>::typeinfo,0);
                }
                if ((*(byte *)(local_140 + 0x38) & 1) == 0) {
                  std::vector<long,_std::allocator<long>_>::data
                            ((vector<long,_std::allocator<long>_> *)0xd135de);
                }
              }
              else {
                DVar2 = helper::GetDataType<unsigned_char>();
                if (DVar1 == DVar2) {
                  if (in_RSI == (BP5Serializer *)0x0) {
                    local_158 = 0;
                  }
                  else {
                    local_158 = __dynamic_cast(in_RSI,&core::AttributeBase::typeinfo,
                                               &core::Attribute<unsigned_char>::typeinfo,0);
                  }
                  if ((*(byte *)(local_158 + 0x38) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xd1369d);
                  }
                }
                else {
                  DVar2 = helper::GetDataType<unsigned_short>();
                  if (DVar1 == DVar2) {
                    if (in_RSI == (BP5Serializer *)0x0) {
                      local_170 = 0;
                    }
                    else {
                      local_170 = __dynamic_cast(in_RSI,&core::AttributeBase::typeinfo,
                                                 &core::Attribute<unsigned_short>::typeinfo,0);
                    }
                    if ((*(byte *)(local_170 + 0x38) & 1) == 0) {
                      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0xd1375c
                                );
                    }
                  }
                  else {
                    DVar2 = helper::GetDataType<unsigned_int>();
                    if (DVar1 == DVar2) {
                      if (in_RSI == (BP5Serializer *)0x0) {
                        local_188 = 0;
                      }
                      else {
                        local_188 = __dynamic_cast(in_RSI,&core::AttributeBase::typeinfo,
                                                   &core::Attribute<unsigned_int>::typeinfo,0);
                      }
                      if ((*(byte *)(local_188 + 0x38) & 1) == 0) {
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xd1381b);
                      }
                    }
                    else {
                      DVar2 = helper::GetDataType<unsigned_long>();
                      if (DVar1 == DVar2) {
                        if (in_RSI == (BP5Serializer *)0x0) {
                          local_1a0 = 0;
                        }
                        else {
                          local_1a0 = __dynamic_cast(in_RSI,&core::AttributeBase::typeinfo,
                                                     &core::Attribute<unsigned_long>::typeinfo,0);
                        }
                        if ((*(byte *)(local_1a0 + 0x38) & 1) == 0) {
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     0xd138d1);
                        }
                      }
                      else {
                        DVar2 = helper::GetDataType<float>();
                        if (DVar1 == DVar2) {
                          if (in_RSI == (BP5Serializer *)0x0) {
                            local_1b8 = 0;
                          }
                          else {
                            local_1b8 = __dynamic_cast(in_RSI,&core::AttributeBase::typeinfo,
                                                       &core::Attribute<float>::typeinfo,0);
                          }
                          if ((*(byte *)(local_1b8 + 0x38) & 1) == 0) {
                            std::vector<float,_std::allocator<float>_>::data
                                      ((vector<float,_std::allocator<float>_> *)0xd1397b);
                          }
                        }
                        else {
                          DVar2 = helper::GetDataType<double>();
                          if (DVar1 == DVar2) {
                            if (in_RSI == (BP5Serializer *)0x0) {
                              local_1d0 = 0;
                            }
                            else {
                              local_1d0 = __dynamic_cast(in_RSI,&core::AttributeBase::typeinfo,
                                                         &core::Attribute<double>::typeinfo,0);
                            }
                            if ((*(byte *)(local_1d0 + 0x38) & 1) == 0) {
                              std::vector<double,_std::allocator<double>_>::data
                                        ((vector<double,_std::allocator<double>_> *)0xd13a25);
                            }
                          }
                          else {
                            DVar2 = helper::GetDataType<long_double>();
                            if (DVar1 == DVar2) {
                              if (in_RSI == (BP5Serializer *)0x0) {
                                local_1e8 = 0;
                              }
                              else {
                                local_1e8 = __dynamic_cast(in_RSI,&core::AttributeBase::typeinfo,
                                                           &core::Attribute<long_double>::typeinfo,0
                                                          );
                              }
                              if ((*(byte *)(local_1e8 + 0x38) & 1) == 0) {
                                std::vector<long_double,_std::allocator<long_double>_>::data
                                          ((vector<long_double,_std::allocator<long_double>_> *)
                                           0xd13acf);
                              }
                            }
                            else {
                              DVar2 = helper::GetDataType<std::complex<float>>();
                              if (DVar1 == DVar2) {
                                if (in_RSI == (BP5Serializer *)0x0) {
                                  local_200 = 0;
                                }
                                else {
                                  local_200 = __dynamic_cast(in_RSI,&core::AttributeBase::typeinfo,
                                                             &core::Attribute<std::complex<float>>::
                                                              typeinfo,0);
                                }
                                if ((*(byte *)(local_200 + 0x38) & 1) == 0) {
                                  std::
                                  vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                  ::data((vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                          *)0xd13b79);
                                }
                              }
                              else {
                                DVar2 = helper::GetDataType<std::complex<double>>();
                                if (DVar1 == DVar2) {
                                  if (in_RSI == (BP5Serializer *)0x0) {
                                    local_218 = 0;
                                  }
                                  else {
                                    local_218 = __dynamic_cast(in_RSI,&core::AttributeBase::typeinfo
                                                               ,&core::
                                                  Attribute<std::complex<double>>::typeinfo,0);
                                  }
                                  if ((*(byte *)(local_218 + 0x38) & 1) == 0) {
                                    std::
                                    vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                    ::data((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                            *)0xd13c20);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    OnetimeMarshalAttribute
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
               (size_t)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  }
  return;
}

Assistant:

void BP5Serializer::OnetimeMarshalAttribute(const core::AttributeBase &baseAttr)
{
    const char *Name = baseAttr.m_Name.c_str();
    const DataType Type = baseAttr.m_Type;
    size_t ElemCount = baseAttr.m_Elements;
    const void *Data = nullptr;
    if (baseAttr.m_IsSingleValue)
        ElemCount = (size_t)-1;
    if (Type == DataType::None)
    {
        return;
    }
    else if (Type == helper::GetDataType<std::string>())
    {
        const core::Attribute<std::string> *attribute =
            dynamic_cast<const core::Attribute<std::string> *>(&baseAttr);
        if (attribute->m_IsSingleValue)
        {
            Data = (void *)&attribute->m_DataSingleValue;
        }
        else
        {
            Data = &(attribute->m_DataArray[0]);
        }
    }
#define per_type_code(T)                                                                           \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        const core::Attribute<T> *attribute = dynamic_cast<const core::Attribute<T> *>(&baseAttr); \
        Data = (void *)(&attribute->m_DataSingleValue);                                            \
        if (!attribute->m_IsSingleValue)                                                           \
        {                                                                                          \
            Data = (void *)attribute->m_DataArray.data();                                          \
        }                                                                                          \
    }

    ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(per_type_code)
#undef per_type_code

    OnetimeMarshalAttribute(Name, Type, ElemCount, Data);
}